

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

int ncnn::from_bgr2gray(uchar *bgr,int w,int h,int stride,Mat *m,Allocator *allocator)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  byte *in_RDI;
  Mat *in_R8;
  undefined8 in_R9;
  bool bVar2;
  int remain;
  int y;
  float *ptr;
  int wgap;
  uchar B2Y;
  uchar G2Y;
  uchar R2Y;
  uchar Y_shift;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar4;
  size_t in_stack_ffffffffffffffa8;
  float *pfVar5;
  int local_30;
  int local_2c;
  byte *local_28;
  int local_1c;
  
  Mat::create(in_R8,(int)((ulong)in_R9 >> 0x20),(int)in_R9,0x84d961d,in_stack_ffffffffffffffa8,
              (Allocator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  bVar2 = true;
  if (in_R8->data != (void *)0x0) {
    bVar2 = in_R8->cstep * (long)in_R8->c == 0;
  }
  if (bVar2) {
    local_1c = -100;
  }
  else {
    iVar1 = in_ECX + in_ESI * -3;
    local_30 = in_EDX;
    local_2c = in_ESI;
    if (iVar1 == 0) {
      local_2c = in_ESI * in_EDX;
      local_30 = 1;
    }
    pfVar5 = (float *)in_R8->data;
    local_28 = in_RDI;
    for (iVar4 = 0; iVar3 = local_2c, iVar4 < local_30; iVar4 = iVar4 + 1) {
      for (; 0 < iVar3; iVar3 = iVar3 + -1) {
        *pfVar5 = (float)((int)((uint)local_28[2] * 0x4d + (uint)local_28[1] * 0x96 +
                               (uint)*local_28 * 0x1d) >> 8);
        local_28 = local_28 + 3;
        pfVar5 = pfVar5 + 1;
      }
      local_28 = local_28 + iVar1;
    }
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

static int from_bgr2gray(const unsigned char* bgr, int w, int h, int stride, Mat& m, Allocator* allocator)
{
    // coeffs for r g b = 0.299f, 0.587f, 0.114f
    const unsigned char Y_shift = 8; //14
    const unsigned char R2Y = 77;
    const unsigned char G2Y = 150;
    const unsigned char B2Y = 29;

    m.create(w, h, 1, 4u, allocator);
    if (m.empty())
        return -100;

    const int wgap = stride - w * 3;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    float* ptr = m;

    for (int y = 0; y < h; y++)
    {
#if __ARM_NEON
        int nn = w >> 3;
        int remain = w - (nn << 3);
#else
        int remain = w;
#endif // __ARM_NEON

#if __ARM_NEON
#if !NCNN_GNU_INLINE_ASM || __aarch64__
        uint8x8_t _R2Y = vdup_n_u8(R2Y);
        uint8x8_t _G2Y = vdup_n_u8(G2Y);
        uint8x8_t _B2Y = vdup_n_u8(B2Y);
        for (; nn > 0; nn--)
        {
            uint8x8x3_t _rgb = vld3_u8(bgr);

            uint16x8_t _y16 = vmull_u8(_rgb.val[2], _R2Y);
            _y16 = vmlal_u8(_y16, _rgb.val[1], _G2Y);
            _y16 = vmlal_u8(_y16, _rgb.val[0], _B2Y);
            _y16 = vshrq_n_u16(_y16, Y_shift);

            float32x4_t _ylow = vcvtq_f32_u32(vmovl_u16(vget_low_u16(_y16)));
            float32x4_t _yhigh = vcvtq_f32_u32(vmovl_u16(vget_high_u16(_y16)));

            vst1q_f32(ptr, _ylow);
            vst1q_f32(ptr + 4, _yhigh);

            bgr += 3 * 8;
            ptr += 8;
        }
#else
        if (nn > 0)
        {
            asm volatile(
                "vdup.u8    d16, %6             \n"
                "vdup.u8    d17, %7             \n"
                "vdup.u8    d18, %8             \n"
                "0:                             \n"
                "pld        [%1, #256]          \n"
                "vld3.u8    {d0-d2}, [%1]!      \n"
                "vmull.u8   q2, d2, d16         \n"
                "vmlal.u8   q2, d1, d17         \n"
                "vmlal.u8   q2, d0, d18         \n"
                "vshr.u16   q2, q2, #8          \n" // Y_shift
                "vmovl.u16  q0, d4              \n"
                "vmovl.u16  q1, d5              \n"
                "vcvt.f32.u32   q0, q0          \n"
                "vcvt.f32.u32   q1, q1          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d3}, [%2]!      \n"
                "bne        0b                  \n"
                : "=r"(nn),  // %0
                "=r"(bgr), // %1
                "=r"(ptr)  // %2
                : "0"(nn),
                "1"(bgr),
                "2"(ptr),
                "r"(R2Y), // %6
                "r"(G2Y), // %7
                "r"(B2Y)  // %8
                : "cc", "memory", "q0", "q1", "q2", "q8", "q9");
        }
#endif // __aarch64__
#endif // __ARM_NEON
        for (; remain > 0; remain--)
        {
            *ptr = static_cast<float>((bgr[2] * R2Y + bgr[1] * G2Y + bgr[0] * B2Y) >> Y_shift);

            bgr += 3;
            ptr++;
        }

        bgr += wgap;
    }

    return 0;
}